

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_Vocoder_clear(HTS_Vocoder *v)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    if (*(long *)(in_RDI + 0x78) != 0) {
      HTS_free((void *)0x114068);
      *(undefined8 *)(in_RDI + 0x78) = 0;
    }
    *(undefined8 *)(in_RDI + 0x80) = 0;
    if (*(long *)(in_RDI + 0xf0) != 0) {
      HTS_free((void *)0x1140a1);
      *(undefined8 *)(in_RDI + 0xf0) = 0;
    }
    *(undefined8 *)(in_RDI + 0xf8) = 0;
    if (*(long *)(in_RDI + 0xe0) != 0) {
      HTS_free((void *)0x1140dd);
      *(undefined8 *)(in_RDI + 0xe0) = 0;
    }
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    if (*(long *)(in_RDI + 0xb0) != 0) {
      HTS_free((void *)0x114119);
      *(undefined8 *)(in_RDI + 0xb0) = 0;
    }
    *(undefined8 *)(in_RDI + 0xb8) = 0;
    if (*(long *)(in_RDI + 0x88) != 0) {
      HTS_free((void *)0x114155);
      *(undefined8 *)(in_RDI + 0x88) = 0;
    }
    *(undefined8 *)(in_RDI + 0x90) = 0;
    if (*(long *)(in_RDI + 0xc0) != 0) {
      HTS_free((void *)0x114191);
      *(undefined8 *)(in_RDI + 0xc0) = 0;
    }
    *(undefined8 *)(in_RDI + 0x60) = 0;
    *(undefined8 *)(in_RDI + 0x68) = 0;
    if (*(long *)(in_RDI + 0x58) != 0) {
      HTS_free((void *)0x1141d0);
      *(undefined8 *)(in_RDI + 0x58) = 0;
    }
  }
  return;
}

Assistant:

void HTS_Vocoder_clear(HTS_Vocoder * v)
{
   if (v != NULL) {
      /* free buffer */
      if (v->freqt_buff != NULL) {
         HTS_free(v->freqt_buff);
         v->freqt_buff = NULL;
      }
      v->freqt_size = 0;
      if (v->gc2gc_buff != NULL) {
         HTS_free(v->gc2gc_buff);
         v->gc2gc_buff = NULL;
      }
      v->gc2gc_size = 0;
      if (v->lsp2lpc_buff != NULL) {
         HTS_free(v->lsp2lpc_buff);
         v->lsp2lpc_buff = NULL;
      }
      v->lsp2lpc_size = 0;
      if (v->postfilter_buff != NULL) {
         HTS_free(v->postfilter_buff);
         v->postfilter_buff = NULL;
      }
      v->postfilter_size = 0;
      if (v->spectrum2en_buff != NULL) {
         HTS_free(v->spectrum2en_buff);
         v->spectrum2en_buff = NULL;
      }
      v->spectrum2en_size = 0;
      if (v->c != NULL) {
         HTS_free(v->c);
         v->c = NULL;
      }
      v->excite_buff_size = 0;
      v->excite_buff_index = 0;
      if (v->excite_ring_buff != NULL) {
         HTS_free(v->excite_ring_buff);
         v->excite_ring_buff = NULL;
      }
   }
}